

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::assignPWproduct4setup<double,double>
          (SSVectorBase<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y)

{
  int *piVar1;
  pointer pdVar2;
  int *piVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  ulong uVar15;
  
  clear(this);
  this->setupStatus = false;
  lVar9 = (long)(x->super_IdxSet).num;
  lVar7 = (long)(y->super_IdxSet).num;
  if (0 < lVar7 && 0 < lVar9) {
    lVar9 = lVar9 + -1;
    lVar7 = lVar7 + -1;
    piVar1 = (x->super_IdxSet).idx;
    pdVar2 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar10 = *piVar1;
    piVar3 = (y->super_IdxSet).idx;
    pdVar4 = (y->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (this->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar11 = 0;
    uVar13 = 0;
    piVar14 = piVar3;
    do {
      iVar8 = *piVar14;
      uVar13 = (ulong)(int)uVar13;
      while( true ) {
        if (((int)lVar9 <= (int)uVar13) || ((int)lVar7 <= (int)uVar11)) goto LAB_001fab38;
        if (iVar10 == iVar8) break;
        if (iVar8 <= iVar10) goto LAB_001fab1b;
        uVar13 = uVar13 + 1;
        iVar10 = piVar1[(int)uVar13];
      }
      pdVar5[iVar10] = pdVar2[iVar10] * pdVar4[iVar10];
      uVar12 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar12;
      iVar10 = piVar1[(int)uVar12];
LAB_001fab1b:
      uVar15 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
      piVar14 = piVar3 + uVar15 + 1;
    } while( true );
  }
LAB_001fab6b:
  setup(this);
  return this;
LAB_001fab38:
  while (((long)uVar13 < lVar9 && (iVar10 != iVar8))) {
    lVar6 = uVar13 + 1;
    uVar13 = uVar13 + 1;
    iVar10 = piVar1[lVar6];
  }
  lVar9 = (long)(int)uVar11;
  while ((lVar9 < lVar7 && (iVar10 != iVar8))) {
    lVar6 = lVar9 + 1;
    lVar9 = lVar9 + 1;
    iVar8 = piVar3[lVar6];
  }
  if (iVar10 == iVar8) {
    pdVar5[iVar10] = pdVar2[iVar10] * pdVar4[iVar10];
  }
  goto LAB_001fab6b;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assignPWproduct4setup(const SSVectorBase<S>& x,
      const SSVectorBase<T>& y)
{
   assert(dim() == x.dim());
   assert(x.dim() == y.dim());
   assert(x.isSetup());
   assert(y.isSetup());

   clear();
   setupStatus = false;

   int i = 0;
   int j = 0;
   int n = x.size() - 1;
   int m = y.size() - 1;

   /* both x and y non-zero vectors? */
   if(m >= 0 && n >= 0)
   {
      int xi = x.index(i);
      int yj = y.index(j);

      while(i < n && j < m)
      {
         if(xi == yj)
         {
            VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
            xi = x.index(++i);
            yj = y.index(++j);
         }
         else if(xi < yj)
            xi = x.index(++i);
         else
            yj = y.index(++j);
      }

      /* check (possible) remaining indices */

      while(i < n && xi != yj)
         xi = x.index(++i);

      while(j < m && xi != yj)
         yj = y.index(++j);

      if(xi == yj)
         VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
   }

   setup();

   assert(isConsistent());

   return *this;
}